

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O3

void __thiscall Kss_Emu::cpu_write(Kss_Emu *this,uint addr,int data)

{
  state_t *psVar1;
  int logical;
  ulong uVar2;
  
  if (addr == 0xb000) {
    logical = 1;
  }
  else {
    if (addr != 0x9000) {
      uVar2 = (ulong)(addr & 0xdfff) ^ 0x9800;
      if ((uint)uVar2 < 0x90) {
        this->scc_accessed = true;
        psVar1 = (this->super_Kss_Cpu).state;
        Scc_Apu::run_until(&this->scc,psVar1->base + psVar1->time);
        (this->scc).regs[uVar2] = (uchar)data;
      }
      return;
    }
    logical = 0;
  }
  set_bank(this,logical,data & 0xff);
  return;
}

Assistant:

void Kss_Emu::cpu_write( unsigned addr, int data )
{
	data &= 0xFF;
	switch ( addr )
	{
	case 0x9000:
		set_bank( 0, data );
		return;
	
	case 0xB000:
		set_bank( 1, data );
		return;
	}
	
	int scc_addr = (addr & 0xDFFF) ^ 0x9800;
	if ( scc_addr < scc.reg_count )
	{
		scc_accessed = true;
		scc.write( time(), scc_addr, data );
		return;
	}
	
	debug_printf( "LD ($%04X),$%02X\n", addr, data );
}